

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vuc.c
# Opt level: O1

void vuc_prep(disisa *isa)

{
  int iVar1;
  int f;
  int f_00;
  int iVar2;
  int v;
  int v_00;
  vardata *data;
  
  data = vardata_new("vuc");
  isa->vardata = data;
  iVar1 = vardata_add_feature(data,"vp2op","VP2 exclusive opcodes");
  f = vardata_add_feature(isa->vardata,"vp3op","VP3+ opcodes");
  f_00 = vardata_add_feature(isa->vardata,"vp4op","VP4 opcodes");
  if (((iVar1 != -1) && (f != -1)) && (f_00 != -1)) {
    iVar2 = vardata_add_varset(isa->vardata,"vp","VP version");
    if (iVar2 != -1) {
      v = vardata_add_variant(isa->vardata,"vp2","VP2",iVar2);
      v_00 = vardata_add_variant(isa->vardata,"vp3","VP3",iVar2);
      iVar2 = vardata_add_variant(isa->vardata,"vp4","VP4",iVar2);
      if (((v != -1) && (v_00 != -1)) && (iVar2 != -1)) {
        vardata_variant_feature(isa->vardata,v,iVar1);
        vardata_variant_feature(isa->vardata,v_00,f);
        vardata_variant_feature(isa->vardata,iVar2,f);
        vardata_variant_feature(isa->vardata,iVar2,f_00);
        iVar1 = vardata_validate(isa->vardata);
        if (iVar1 == 0) {
          return;
        }
      }
    }
  }
  abort();
}

Assistant:

static void vuc_prep(struct disisa *isa) {
	isa->vardata = vardata_new("vuc");
	int f_vp2op = vardata_add_feature(isa->vardata, "vp2op", "VP2 exclusive opcodes");
	int f_vp3op = vardata_add_feature(isa->vardata, "vp3op", "VP3+ opcodes");
	int f_vp4op = vardata_add_feature(isa->vardata, "vp4op", "VP4 opcodes");
	if (f_vp2op == -1 || f_vp3op == -1 || f_vp4op == -1)
		abort();
	int vs_vp = vardata_add_varset(isa->vardata, "vp", "VP version");
	if (vs_vp == -1)
		abort();
	int v_vp2 = vardata_add_variant(isa->vardata, "vp2", "VP2", vs_vp);
	int v_vp3 = vardata_add_variant(isa->vardata, "vp3", "VP3", vs_vp);
	int v_vp4 = vardata_add_variant(isa->vardata, "vp4", "VP4", vs_vp);
	if (v_vp2 == -1 || v_vp3 == -1 || v_vp4 == -1)
		abort();
	vardata_variant_feature(isa->vardata, v_vp2, f_vp2op);
	vardata_variant_feature(isa->vardata, v_vp3, f_vp3op);
	vardata_variant_feature(isa->vardata, v_vp4, f_vp3op);
	vardata_variant_feature(isa->vardata, v_vp4, f_vp4op);
	if (vardata_validate(isa->vardata))
		abort();
}